

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

pa_buffer_attr *
set_buffering_attribute
          (pa_buffer_attr *__return_storage_ptr__,uint latency_frames,pa_sample_spec *sample_spec)

{
  cubeb_log_level cVar1;
  size_t sVar2;
  cubeb_log_callback p_Var3;
  uint uVar4;
  uint uVar5;
  
  __return_storage_ptr__->maxlength = 0xffffffff;
  __return_storage_ptr__->prebuf = 0xffffffff;
  sVar2 = (*cubeb_pa_frame_size)(sample_spec);
  uVar4 = (int)sVar2 * latency_frames;
  __return_storage_ptr__->tlength = uVar4;
  uVar5 = uVar4 >> 2;
  __return_storage_ptr__->minreq = uVar5;
  __return_storage_ptr__->fragsize = uVar5;
  cVar1 = cubeb_log_get_level();
  if (cVar1 != CUBEB_LOG_DISABLED) {
    p_Var3 = cubeb_log_get_callback();
    if (p_Var3 != (cubeb_log_callback)0x0) {
      cubeb_log_internal("cubeb_pulse.c",0x39c,
                         "Requested buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u"
                         ,0xffffffffffffffff,(ulong)uVar4,0xffffffff,(ulong)uVar5,(ulong)uVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static pa_buffer_attr
set_buffering_attribute(unsigned int latency_frames,
                        pa_sample_spec * sample_spec)
{
  pa_buffer_attr battr;
  battr.maxlength = -1;
  battr.prebuf = -1;
  battr.tlength = latency_frames * WRAP(pa_frame_size)(sample_spec);
  battr.minreq = battr.tlength / 4;
  battr.fragsize = battr.minreq;

  LOG("Requested buffer attributes maxlength %u, tlength %u, prebuf %u, minreq "
      "%u, fragsize %u",
      battr.maxlength, battr.tlength, battr.prebuf, battr.minreq,
      battr.fragsize);

  return battr;
}